

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O3

bool __thiscall CProficiencies::InterpCommand(CProficiencies *this,char *command,char *argument)

{
  code *pcVar1;
  char *profname;
  ushort uVar2;
  long lVar3;
  CProficiencies *pCVar4;
  char_data *pcVar5;
  long lVar6;
  long lVar7;
  allocator<char> local_61;
  CProficiencies *local_60;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if ((*command != '\0') &&
     ((long)prof_cmd_table.super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)prof_cmd_table.super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>._M_impl
            .super__Vector_impl_data._M_start != 0)) {
    lVar6 = ((long)prof_cmd_table.super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)prof_cmd_table.super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    lVar7 = 0x10;
    local_60 = this;
    local_58 = argument;
    do {
      pcVar1 = *(code **)((long)prof_cmd_table.
                                super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar7 + -8);
      profname = *(char **)((long)&(prof_cmd_table.
                                    super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->name + lVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,
                 *(char **)((long)prof_cmd_table.
                                  super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar7 + -0x10),
                 &local_61);
      strlen(command);
      lVar3 = std::__cxx11::string::find((char *)local_50,(ulong)command,0);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (lVar3 != -1) {
        uVar2 = ProfIndexLookup(profname);
        if ((profname == "none") || (uVar2 == 0xffff)) {
          pcVar5 = local_60->ch;
LAB_00371f55:
          (*pcVar1)(pcVar5,local_58);
          return true;
        }
        if (uVar2 < 0x19) {
          pcVar5 = local_60->ch;
          if (pcVar5->pcdata == (PC_DATA *)0x0) {
            pCVar4 = &prof_none;
          }
          else {
            pCVar4 = &pcVar5->pcdata->profs;
          }
          if (-1 < pCVar4->profs[uVar2]) goto LAB_00371f55;
        }
      }
      lVar7 = lVar7 + 0x18;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return false;
}

Assistant:

bool CProficiencies::InterpCommand(char *command, char *argument)
{
	if (strlen(command) == 0)
		return false;

	auto prof_cmd_table_size = std::size(prof_cmd_table);
	for (auto i = 0; i < prof_cmd_table_size; i++)
	{
		auto cmd = prof_cmd_table[i];
		auto foundPos = std::string(cmd.name).find(command);
		if (foundPos == std::string::npos)
			continue;
		
		auto pindex = ProfIndexLookup(cmd.requires);
		if (cmd.requires == "none" || pindex == -1 || ch->Profs()->HasProf(pindex))
		{
			(cmd.cmd) (ch, argument);
			return true;
		}
	}
			
	return false;
}